

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RewardModelMappingSparseMapped.cpp
# Opt level: O2

void __thiscall
RewardModelMappingSparseMapped::~RewardModelMappingSparseMapped
          (RewardModelMappingSparseMapped *this)

{
  (this->super_RewardModel).super_RewardModelDiscreteInterface.super_QTableInterface.
  _vptr_QTableInterface = (_func_int **)&PTR_Get_00606dd0;
  std::
  _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_double>,_std::_Select1st<std::pair<const_unsigned_long,_double>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_double>_>_>
  ::~_Rb_tree((_Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_double>,_std::_Select1st<std::pair<const_unsigned_long,_double>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_double>_>_>
               *)&(this->_m_R).data_);
  std::__cxx11::string::~string((string *)&this->_m_ja_str);
  std::__cxx11::string::~string((string *)&this->_m_s_str);
  return;
}

Assistant:

RewardModelMappingSparseMapped::~RewardModelMappingSparseMapped()
{
}